

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# words.c
# Opt level: O3

int32_t exp2s(int log)

{
  uint uVar1;
  int32_t iVar2;
  char cVar3;
  
  if (-1 < log) {
    cVar3 = (char)((uint)log >> 8);
    uVar1 = (""[(ulong)(uint)log & 0xff] | 0x100) << (cVar3 - 9U & 0x1f);
    if ((uint)log < 0xa00) {
      uVar1 = (""[(ulong)(uint)log & 0xff] | 0x100) >> (9U - cVar3 & 0x1f);
    }
    return uVar1;
  }
  iVar2 = exp2s(-log);
  return -iVar2;
}

Assistant:

int32_t exp2s (int log)
{
    uint32_t value;

    if (log < 0)
        return -exp2s (-log);

    value = exp2_table [log & 0xff] | 0x100;

    if ((log >>= 8) <= 9)
        return value >> (9 - log);
    else
        return value << (log - 9);
}